

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

void OnSetTriggerCtx(ecs_iter_t *it)

{
  EcsTrigger *ct_00;
  void *pvVar1;
  int local_24;
  int32_t i;
  EcsContext *ctx;
  EcsTrigger *ct;
  ecs_iter_t *it_local;
  
  ct_00 = (EcsTrigger *)ecs_column_w_size(it,0x28,1);
  pvVar1 = ecs_column_w_size(it,8,2);
  for (local_24 = 0; local_24 < it->count; local_24 = local_24 + 1) {
    ct_00[local_24].ctx = *(void **)((long)pvVar1 + (long)local_24 * 8);
  }
  trigger_set(it->world,it->entities,ct_00,it->count);
  return;
}

Assistant:

static
void OnSetTriggerCtx(
    ecs_iter_t *it)
{
    EcsTrigger *ct = ecs_column(it, EcsTrigger, 1);
    EcsContext *ctx = ecs_column(it, EcsContext, 2);

    int32_t i;
    for (i = 0; i < it->count; i ++) {
        ct[i].ctx = (void*)ctx[i].ctx;
    }

    trigger_set(it->world, it->entities, ct, it->count);    
}